

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[2],unsigned_int,char[5],unsigned_int,char[6],unsigned_int,char[5],unsigned_int,char[6],unsigned_int,char[5],unsigned_int,char[24]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [2],uint *RestArgs,char (*RestArgs_1) [5],uint *RestArgs_2,
               char (*RestArgs_3) [6],uint *RestArgs_4,char (*RestArgs_5) [5],uint *RestArgs_6,
               char (*RestArgs_7) [6],uint *RestArgs_8,char (*RestArgs_9) [5],uint *RestArgs_10,
               char (*RestArgs_11) [24])

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  std::ostream::_M_insert<unsigned_long>((ulong)(ss + 0x10));
  FormatStrSS<std::__cxx11::stringstream,char[5],unsigned_int,char[6],unsigned_int,char[5],unsigned_int,char[6],unsigned_int,char[5],unsigned_int,char[24]>
            (ss,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,RestArgs_7,
             RestArgs_8,RestArgs_9,RestArgs_10,RestArgs_11);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}